

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_record.c
# Opt level: O0

ares_status_t
ares_dns_rr_set_abin_own(ares_dns_rr_t *dns_rr,ares_dns_rr_key_t key,ares_dns_multistring_t *strs)

{
  ares_dns_datatype_t aVar1;
  long *plVar2;
  ares_dns_multistring_t **strs_ptr;
  ares_dns_multistring_t *strs_local;
  ares_dns_rr_key_t key_local;
  ares_dns_rr_t *dns_rr_local;
  
  aVar1 = ares_dns_rr_key_datatype(key);
  if (aVar1 == ARES_DATATYPE_ABINP) {
    plVar2 = (long *)ares_dns_rr_data_ptr(dns_rr,key,(size_t **)0x0);
    if (plVar2 == (long *)0x0) {
      dns_rr_local._4_4_ = ARES_EFORMERR;
    }
    else {
      if (*plVar2 != 0) {
        ares_dns_multistring_destroy((ares_dns_multistring_t *)*plVar2);
      }
      *plVar2 = (long)strs;
      dns_rr_local._4_4_ = ARES_SUCCESS;
    }
  }
  else {
    dns_rr_local._4_4_ = ARES_EFORMERR;
  }
  return dns_rr_local._4_4_;
}

Assistant:

ares_status_t ares_dns_rr_set_abin_own(ares_dns_rr_t          *dns_rr,
                                       ares_dns_rr_key_t       key,
                                       ares_dns_multistring_t *strs)
{
  ares_dns_multistring_t **strs_ptr;

  if (ares_dns_rr_key_datatype(key) != ARES_DATATYPE_ABINP) {
    return ARES_EFORMERR;
  }

  strs_ptr = ares_dns_rr_data_ptr(dns_rr, key, NULL);
  if (strs_ptr == NULL) {
    return ARES_EFORMERR;
  }

  if (*strs_ptr != NULL) {
    ares_dns_multistring_destroy(*strs_ptr);
  }
  *strs_ptr = strs;

  return ARES_SUCCESS;
}